

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuThreads.cpp
# Opt level: O1

void __thiscall xmrig::CpuThreads::CpuThreads(CpuThreads *this,Value *value)

{
  pointer *ppCVar1;
  uint16_t uVar2;
  ushort uVar3;
  iterator iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Number NVar8;
  Value *pVVar9;
  int __base;
  size_t i;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *v;
  Value *pVVar14;
  CpuThread thread;
  CpuThread local_40;
  
  this->m_format = ArrayFormat;
  this->m_affinity = -1;
  (this->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = (value->data_).f.flags;
  if (uVar2 == 3) {
    uVar6 = Json::getUint(value,"intensity",1);
    uVar7 = Json::getUint(value,"threads",0);
    uVar5 = 0x400;
    if (uVar7 < 0x400) {
      uVar5 = uVar7;
    }
    pVVar14 = Json::getValue(value,"affinity");
    uVar3 = (pVVar14->data_).f.flags;
    if ((char)uVar3 < '\0') {
      NVar8 = (pVVar14->data_).n;
    }
    else {
      NVar8.i64 = -1;
      if ((uVar3 >> 10 & 1) != 0) {
        if ((uVar3 >> 0xc & 1) == 0) {
          pVVar14 = (Value *)((ulong)(pVVar14->data_).s.str & 0xffffffffffff);
        }
        pVVar9 = (Value *)strstr((char *)pVVar14,"0x");
        if (pVVar9 == (Value *)0x0) {
          __base = 10;
        }
        else {
          __base = 0x10;
          pVVar14 = pVVar9;
        }
        NVar8.i64 = strtoll((char *)pVVar14,(char **)0x0,__base);
      }
    }
    this->m_affinity = (int64_t)NVar8;
    this->m_format = ObjectFormat;
    if (uVar6 - 6 < 0xfffffffb) {
      uVar6 = 1;
    }
    if (uVar7 != 0) {
      uVar11 = 0;
      do {
        local_40.m_affinity = 0xffffffffffffffff;
        if (this->m_affinity != 0xffffffffffffffff) {
          uVar10 = 0;
          uVar12 = 0;
          do {
            if (((ulong)this->m_affinity >> (uVar10 & 0x3f) & 1) != 0) {
              local_40.m_affinity = uVar10;
              if (uVar12 == uVar11) break;
              uVar12 = uVar12 + 1;
            }
            uVar10 = uVar10 + 1;
            local_40.m_affinity = 0xffffffffffffffff;
          } while (uVar10 != 0x40);
        }
        iVar4._M_current =
             (this->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_40.m_intensity = uVar6;
          std::vector<xmrig::CpuThread,std::allocator<xmrig::CpuThread>>::
          _M_realloc_insert<xmrig::CpuThread_const&>
                    ((vector<xmrig::CpuThread,std::allocator<xmrig::CpuThread>> *)&this->m_data,
                     iVar4,&local_40);
        }
        else {
          (iVar4._M_current)->m_affinity = local_40.m_affinity;
          *(ulong *)&(iVar4._M_current)->m_intensity = CONCAT44(local_40._12_4_,uVar6);
          ppCVar1 = &(this->m_data).
                     super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>._M_impl
                     .super__Vector_impl_data._M_finish;
          *ppCVar1 = *ppCVar1 + 1;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar5);
    }
  }
  else if ((uVar2 == 4) && (uVar11 = (ulong)(value->data_).s.length, uVar11 != 0)) {
    pVVar14 = (Value *)((ulong)(value->data_).s.str & 0xffffffffffff);
    lVar13 = uVar11 << 4;
    do {
      CpuThread::CpuThread(&local_40,pVVar14);
      if (local_40.m_intensity < 6) {
        iVar4._M_current =
             (this->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<xmrig::CpuThread,std::allocator<xmrig::CpuThread>>::
          _M_realloc_insert<xmrig::CpuThread_const&>
                    ((vector<xmrig::CpuThread,std::allocator<xmrig::CpuThread>> *)&this->m_data,
                     iVar4,&local_40);
        }
        else {
          (iVar4._M_current)->m_affinity = local_40.m_affinity;
          *(ulong *)&(iVar4._M_current)->m_intensity =
               CONCAT44(local_40._12_4_,local_40.m_intensity);
          ppCVar1 = &(this->m_data).
                     super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>._M_impl
                     .super__Vector_impl_data._M_finish;
          *ppCVar1 = *ppCVar1 + 1;
        }
      }
      pVVar14 = pVVar14 + 1;
      lVar13 = lVar13 + -0x10;
    } while (lVar13 != 0);
  }
  return;
}

Assistant:

xmrig::CpuThreads::CpuThreads(const rapidjson::Value &value)
{
    if (value.IsArray()) {
        for (auto &v : value.GetArray()) {
            CpuThread thread(v);
            if (thread.isValid()) {
                add(std::move(thread));
            }
        }
    }
    else if (value.IsObject()) {
        uint32_t intensity   = Json::getUint(value, kIntensity, 1);
        const size_t threads = std::min<unsigned>(Json::getUint(value, kThreads), 1024);
        m_affinity           = getAffinityMask(Json::getValue(value, kAffinity));
        m_format             = ObjectFormat;

        if (intensity < 1 || intensity > 5) {
            intensity = 1;
        }

        for (size_t i = 0; i < threads; ++i) {
            add(getAffinity(i, m_affinity), intensity);
        }
    }
}